

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncheck.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (argc == 2) {
    pcVar3 = argv[1];
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar3 = *argv;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106178);
    }
    else {
      sVar2 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," <directorywithjsonfiles>",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"We are going to assume you mean to use the \'",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Gian99Santos[P]simdjson/jsonchecker/"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' directory.",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    pcVar3 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Gian99Santos[P]simdjson/jsonchecker/";
  }
  bVar1 = validate(pcVar3);
  return (int)!bVar1;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2) {
    std::cerr << "Usage: " << argv[0] << " <directorywithjsonfiles>"
              << std::endl;
#ifndef SIMDJSON_TEST_DATA_DIR
    std::cout
        << "We are going to assume you mean to use the 'jsonchecker' directory."
        << std::endl;
    return validate("jsonchecker/") ? EXIT_SUCCESS : EXIT_FAILURE;
#else
    std::cout
        << "We are going to assume you mean to use the '"<< SIMDJSON_TEST_DATA_DIR <<"' directory."
        << std::endl;
    return validate(SIMDJSON_TEST_DATA_DIR) ? EXIT_SUCCESS : EXIT_FAILURE;
#endif
  }
  return validate(argv[1]) ? EXIT_SUCCESS : EXIT_FAILURE;
}